

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylnsymmat.cpp
# Opt level: O0

void __thiscall
TPZSkylNSymMatrix<std::complex<float>_>::MultAdd
          (TPZSkylNSymMatrix<std::complex<float>_> *this,TPZFMatrix<std::complex<float>_> *x,
          TPZFMatrix<std::complex<float>_> *y,TPZFMatrix<std::complex<float>_> *z,
          complex<float> alpha,complex<float> beta,int opt)

{
  int iVar1;
  int64_t iVar2;
  int64_t iVar3;
  _ComplexT _Var4;
  TPZFMatrix<std::complex<float>_> *z_00;
  TPZFMatrix<std::complex<float>_> *pTVar5;
  ostream *poVar6;
  void *this_00;
  complex<float> **ppcVar7;
  complex<float> *pcVar8;
  TPZFMatrix<std::complex<float>_> *in_RCX;
  TPZBaseMatrix *in_RDX;
  TPZFMatrix<std::complex<float>_> *in_RSI;
  TPZBaseMatrix *in_RDI;
  int in_R8D;
  undefined4 in_XMM1_Da;
  undefined4 in_XMM1_Db;
  complex<float> *zp;
  char *in_stack_000000b8;
  complex<float> *diaglast;
  complex<float> *diag;
  complex<float> *p;
  complex<float> val;
  int64_t offset;
  int64_t r;
  int64_t ic;
  int64_t xcols;
  int64_t rows;
  complex<float> *in_stack_fffffffffffffeb8;
  ostream *in_stack_fffffffffffffec8;
  TPZSkylNSymMatrix<std::complex<float>_> *in_stack_fffffffffffffed0;
  ostream *in_stack_fffffffffffffed8;
  TPZFMatrix<std::complex<float>_> *in_stack_fffffffffffffee0;
  int64_t in_stack_ffffffffffffff00;
  TPZFMatrix<std::complex<float>_> *in_stack_ffffffffffffff10;
  TPZMatrix<std::complex<float>_> *in_stack_ffffffffffffff18;
  complex<float> in_stack_ffffffffffffff20;
  complex<float> *local_88;
  complex<float> *local_80;
  complex<float> local_70;
  long local_68;
  long local_60;
  long local_58;
  long local_50;
  int64_t local_48;
  undefined8 local_40;
  int local_34;
  TPZFMatrix<std::complex<float>_> *local_30;
  TPZBaseMatrix *local_28;
  TPZFMatrix<std::complex<float>_> *local_20;
  undefined8 local_10;
  
  local_10 = CONCAT44(in_XMM1_Db,in_XMM1_Da);
  local_34 = in_R8D;
  local_30 = in_RCX;
  local_28 = in_RDX;
  local_20 = in_RSI;
  if (in_R8D == 0) {
    iVar2 = TPZBaseMatrix::Cols(in_RDI);
    iVar3 = TPZBaseMatrix::Rows((TPZBaseMatrix *)local_20);
    if (iVar2 == iVar3) goto LAB_014078ad;
LAB_014078d9:
    TPZMatrix<std::complex<float>_>::Error((char *)diaglast,in_stack_000000b8);
  }
  else {
LAB_014078ad:
    iVar2 = TPZBaseMatrix::Rows(in_RDI);
    iVar3 = TPZBaseMatrix::Rows((TPZBaseMatrix *)local_20);
    if (iVar2 != iVar3) goto LAB_014078d9;
  }
  iVar2 = TPZBaseMatrix::Rows((TPZBaseMatrix *)local_30);
  iVar3 = TPZBaseMatrix::Rows((TPZBaseMatrix *)local_20);
  if (iVar2 == iVar3) {
    in_stack_ffffffffffffff20._M_value = TPZBaseMatrix::Cols((TPZBaseMatrix *)local_30);
    _Var4 = TPZBaseMatrix::Cols((TPZBaseMatrix *)local_20);
    if (in_stack_ffffffffffffff20._M_value != _Var4) goto LAB_01407944;
  }
  else {
LAB_01407944:
    in_stack_ffffffffffffff10 = local_30;
    in_stack_ffffffffffffff18 =
         (TPZMatrix<std::complex<float>_> *)TPZBaseMatrix::Rows((TPZBaseMatrix *)local_20);
    iVar2 = TPZBaseMatrix::Cols((TPZBaseMatrix *)local_20);
    (*(in_stack_ffffffffffffff10->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.
      super_TPZSavable._vptr_TPZSavable[0xe])
              (in_stack_ffffffffffffff10,in_stack_ffffffffffffff18,iVar2);
  }
  z_00 = (TPZFMatrix<std::complex<float>_> *)TPZBaseMatrix::Cols((TPZBaseMatrix *)local_20);
  pTVar5 = (TPZFMatrix<std::complex<float>_> *)TPZBaseMatrix::Cols(local_28);
  if (z_00 == pTVar5) {
    in_stack_ffffffffffffff00 = TPZBaseMatrix::Cols((TPZBaseMatrix *)local_20);
    iVar2 = TPZBaseMatrix::Cols((TPZBaseMatrix *)local_30);
    if (in_stack_ffffffffffffff00 == iVar2) {
      iVar2 = TPZBaseMatrix::Rows((TPZBaseMatrix *)local_20);
      iVar3 = TPZBaseMatrix::Rows(local_28);
      if (iVar2 == iVar3) {
        iVar2 = TPZBaseMatrix::Rows((TPZBaseMatrix *)local_20);
        iVar3 = TPZBaseMatrix::Rows((TPZBaseMatrix *)local_30);
        iVar1 = (int)((ulong)in_stack_ffffffffffffff00 >> 0x20);
        if (iVar2 == iVar3) goto LAB_01407b75;
      }
    }
  }
  iVar1 = (int)((ulong)in_stack_ffffffffffffff00 >> 0x20);
  poVar6 = std::operator<<((ostream *)&std::cout,"x.Cols = ");
  iVar2 = TPZBaseMatrix::Cols((TPZBaseMatrix *)local_20);
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar2);
  in_stack_fffffffffffffec8 = std::operator<<(poVar6," y.Cols()");
  iVar2 = TPZBaseMatrix::Cols(local_28);
  poVar6 = (ostream *)std::ostream::operator<<(in_stack_fffffffffffffec8,iVar2);
  in_stack_fffffffffffffed0 =
       (TPZSkylNSymMatrix<std::complex<float>_> *)std::operator<<(poVar6," z.Cols() ");
  iVar2 = TPZBaseMatrix::Cols((TPZBaseMatrix *)local_30);
  poVar6 = (ostream *)std::ostream::operator<<(in_stack_fffffffffffffed0,iVar2);
  in_stack_fffffffffffffed8 = std::operator<<(poVar6," x.Rows() ");
  iVar2 = TPZBaseMatrix::Rows((TPZBaseMatrix *)local_20);
  poVar6 = (ostream *)std::ostream::operator<<(in_stack_fffffffffffffed8,iVar2);
  in_stack_fffffffffffffee0 =
       (TPZFMatrix<std::complex<float>_> *)std::operator<<(poVar6," y.Rows() ");
  iVar2 = TPZBaseMatrix::Rows(local_28);
  poVar6 = (ostream *)std::ostream::operator<<(in_stack_fffffffffffffee0,iVar2);
  poVar6 = std::operator<<(poVar6," z.Rows() ");
  iVar2 = TPZBaseMatrix::Rows((TPZBaseMatrix *)local_30);
  this_00 = (void *)std::ostream::operator<<(poVar6,iVar2);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  TPZMatrix<std::complex<float>_>::Error((char *)diaglast,in_stack_000000b8);
LAB_01407b75:
  local_40 = local_10;
  TPZMatrix<std::complex<float>_>::PrepareZ
            (in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,z_00,in_stack_ffffffffffffff20,
             iVar1);
  local_48 = TPZBaseMatrix::Rows(in_RDI);
  local_50 = TPZBaseMatrix::Cols((TPZBaseMatrix *)local_20);
  for (local_58 = 0; local_58 < local_50; local_58 = local_58 + 1) {
    for (local_60 = 0; local_60 < local_48; local_60 = local_60 + 1) {
      iVar1 = Size(in_stack_fffffffffffffed0,(int64_t)in_stack_fffffffffffffec8);
      local_68 = (long)iVar1;
      std::complex<float>::complex(&local_70,0.0,0.0);
      TPZFMatrix<std::complex<float>_>::g(local_20,(local_60 - local_68) + 1,local_58);
      if (local_34 == 0) {
        ppcVar7 = TPZVec<std::complex<float>_*>::operator[]
                            ((TPZVec<std::complex<float>_*> *)(in_RDI + 2),local_60);
        local_80 = *ppcVar7 + local_68;
        ppcVar7 = TPZVec<std::complex<float>_*>::operator[]
                            ((TPZVec<std::complex<float>_*> *)(in_RDI + 2),local_60);
        local_88 = *ppcVar7;
      }
      else {
        ppcVar7 = TPZVec<std::complex<float>_*>::operator[]
                            ((TPZVec<std::complex<float>_*> *)(in_RDI + 1),local_60);
        local_80 = *ppcVar7 + local_68;
        ppcVar7 = TPZVec<std::complex<float>_*>::operator[]
                            ((TPZVec<std::complex<float>_*> *)(in_RDI + 1),local_60);
        local_88 = *ppcVar7;
      }
      while (local_80 = local_80 + -1, local_88 < local_80) {
        std::operator*(in_stack_fffffffffffffeb8,(complex<float> *)0x1407d7d);
        std::complex<float>::operator+=
                  ((complex<float> *)in_stack_fffffffffffffed0,
                   (complex<float> *)in_stack_fffffffffffffec8);
      }
      if (local_80 == local_88) {
        TPZVec<std::complex<float>_*>::operator[]
                  ((TPZVec<std::complex<float>_*> *)(in_RDI + 1),local_60);
        std::operator*(in_stack_fffffffffffffeb8,(complex<float> *)0x1407dfc);
        std::complex<float>::operator+=
                  ((complex<float> *)in_stack_fffffffffffffed0,
                   (complex<float> *)in_stack_fffffffffffffec8);
      }
      std::operator*(in_stack_fffffffffffffeb8,(complex<float> *)0x1407e2f);
      TPZFMatrix<std::complex<float>_>::operator()
                (in_stack_fffffffffffffee0,(int64_t)in_stack_fffffffffffffed8,
                 (int64_t)in_stack_fffffffffffffed0);
      std::complex<float>::operator+=
                ((complex<float> *)in_stack_fffffffffffffed0,
                 (complex<float> *)in_stack_fffffffffffffec8);
      TPZFMatrix<std::complex<float>_>::operator()
                (in_stack_fffffffffffffee0,(int64_t)in_stack_fffffffffffffed8,
                 (int64_t)in_stack_fffffffffffffed0);
      pcVar8 = TPZFMatrix<std::complex<float>_>::g(local_20,local_60,local_58);
      local_70._M_value = pcVar8->_M_value;
      if (local_34 == 0) {
        ppcVar7 = TPZVec<std::complex<float>_*>::operator[]
                            ((TPZVec<std::complex<float>_*> *)(in_RDI + 1),local_60);
        local_80 = *ppcVar7 + local_68;
        ppcVar7 = TPZVec<std::complex<float>_*>::operator[]
                            ((TPZVec<std::complex<float>_*> *)(in_RDI + 1),local_60);
        local_88 = *ppcVar7;
      }
      else {
        ppcVar7 = TPZVec<std::complex<float>_*>::operator[]
                            ((TPZVec<std::complex<float>_*> *)(in_RDI + 2),local_60);
        local_80 = *ppcVar7 + local_68;
        ppcVar7 = TPZVec<std::complex<float>_*>::operator[]
                            ((TPZVec<std::complex<float>_*> *)(in_RDI + 2),local_60);
        local_88 = *ppcVar7;
      }
      while (local_80 = local_80 + -1, local_88 < local_80) {
        std::operator*(in_stack_fffffffffffffeb8,(complex<float> *)0x1407fb8);
        std::operator*(in_stack_fffffffffffffeb8,(complex<float> *)0x1407fd6);
        std::complex<float>::operator+=
                  ((complex<float> *)in_stack_fffffffffffffed0,
                   (complex<float> *)in_stack_fffffffffffffec8);
      }
    }
  }
  return;
}

Assistant:

void TPZSkylNSymMatrix<TVar>::MultAdd(const TPZFMatrix<TVar> &x, const TPZFMatrix<TVar> &y,
  TPZFMatrix<TVar> &z, const TVar alpha, const TVar beta, const int opt)const
{
  // Computes z = beta * y + alpha * opt(this)*x
  // z and x cannot overlap in memory
  if ((!opt && this->Cols() != x.Rows()) || this->Rows() != x.Rows())
    TPZMatrix<TVar>::Error(__PRETTY_FUNCTION__,
    " <matrixs with incompatible dimensions>");
  if (z.Rows() != x.Rows() || z.Cols() != x.Cols())
    z.Redim(x.Rows(), x.Cols());
  if (x.Cols() != y.Cols() || x.Cols() != z.Cols() || x.Rows() != y.Rows()
    || x.Rows() != z.Rows())
  {
    cout << "x.Cols = " << x.Cols() << " y.Cols()" << y.Cols()
        << " z.Cols() " << z.Cols() << " x.Rows() " << x.Rows()
        << " y.Rows() " << y.Rows() << " z.Rows() " << z.Rows() << endl;
    TPZMatrix<TVar>::Error(__PRETTY_FUNCTION__, " incompatible dimensions\n");
  }
  this->PrepareZ(y, z, beta, opt);
  int64_t rows = this->Rows();
  int64_t xcols = x.Cols();
  int64_t ic, r;
  for (ic = 0; ic < xcols; ic++)
  {
    for (r = 0; r < rows; r++)
    {
      int64_t offset = Size(r);
      TVar val = 0.;
      const TVar *p = &x.g((r - offset + 1), ic);
        TVar *diag, *diaglast;
        if (opt == 0)
        {
            diag = fElemb[r] + offset - 1;
            diaglast = fElemb[r];
        }
        else
        {
            diag = fElem[r] + offset - 1;
            diaglast = fElem[r];
        }
      while (diag > diaglast)
      {
        val += *diag--**p;
        p ++;
      }
      if (diag == diaglast)
      {
        diag = fElem[r];
        val += *diag * *p;
      }
      z(r, ic) += val * alpha;
      TVar *zp = &z((r - offset + 1), ic);
      val = x.g(r, ic);
        if(opt == 0)
        {
          diag = fElem[r] + offset - 1;
          diaglast = fElem[r];
        }
        else
        {
            diag = fElemb[r] + offset - 1;
            diaglast = fElemb[r];
        }
      while (diag > diaglast)
      {
        *zp += alpha * *diag--*val;
        zp ++;
      }
      //z.Print("z");
    }
  }
}